

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP4Writer::BP4Writer(BP4Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  Comm *comm_00;
  IO *pIVar1;
  int iVar2;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  Comm local_f8;
  ScopedTimer __var235;
  string local_e8 [2];
  TransportMan *local_a8;
  TransportMan *local_a0;
  BP4Serializer *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"BP4Writer",(allocator *)local_e8);
  helper::Comm::Comm(&local_f8,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&local_f8);
  helper::Comm::~Comm(&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP4Writer_0081cc80;
  comm_00 = &(this->super_Engine).m_Comm;
  adios2::format::BP4Serializer::BP4Serializer(&this->m_BP4Serializer,comm_00);
  local_98 = &this->m_BP4Serializer;
  transportman::TransportMan::TransportMan(&this->m_FileDataManager,io,comm_00);
  local_a0 = &this->m_FileDataManager;
  transportman::TransportMan::TransportMan(&this->m_FileMetadataManager,io,comm_00);
  local_a8 = &this->m_FileMetadataManager;
  transportman::TransportMan::TransportMan(&this->m_FileMetadataIndexManager,io,comm_00);
  this->m_WriteToBB = false;
  this->m_DrainBB = true;
  burstbuffer::FileDrainerSingleThread::FileDrainerSingleThread(&this->m_FileDrainer);
  (this->m_BBName)._M_dataplus._M_p = (pointer)&(this->m_BBName).field_2;
  (this->m_BBName)._M_string_length = 0;
  (this->m_BBName).field_2._M_local_buf[0] = '\0';
  memset(&this->m_SubStreamNames,0,0xad);
  if (BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var35 == '\0') {
    iVar2 = __cxa_guard_acquire(&BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var35);
    if (iVar2 != 0) {
      BP4Writer::__var35 = (void *)ps_timer_create_("BP4Writer::Open");
      __cxa_guard_release(&BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var35);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var235,BP4Writer::__var35);
  pIVar1 = (this->super_Engine).m_IO;
  std::__cxx11::string::string((string *)local_e8,"Verbose",(allocator *)&local_90);
  helper::GetParameter<int>(&pIVar1->m_Parameters,local_e8,&this->m_Verbosity);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::string((string *)local_e8,"Engine",&local_f9);
  std::__cxx11::string::string((string *)&local_90,"BP4Writer",&local_fa);
  std::__cxx11::string::string((string *)&local_70,"Open",&local_fb);
  iVar2 = helper::Comm::Rank(comm_00);
  helper::Log(local_e8,&local_90,&local_70,&(this->super_Engine).m_Name,0,iVar2,5,this->m_Verbosity,
              INFO);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_e8);
  ((this->super_Engine).m_IO)->m_ReadStreaming = false;
  Init(this);
  (this->super_Engine).m_IsOpen = true;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var235);
  return;
}

Assistant:

BP4Writer::BP4Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP4Writer", io, name, mode, std::move(comm)), m_BP4Serializer(m_Comm),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm),
  m_FileMetadataIndexManager(io, m_Comm), m_FileDrainer()
{
    PERFSTUBS_SCOPED_TIMER("BP4Writer::Open");
    helper::GetParameter(m_IO.m_Parameters, "Verbose", m_Verbosity);
    helper::Log("Engine", "BP4Writer", "Open", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    m_IO.m_ReadStreaming = false;

    Init();

    m_IsOpen = true;
}